

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O0

void __thiscall OpenMD::Mie::initialize(Mie *this)

{
  value_type vVar1;
  bool bVar2;
  undefined8 uVar3;
  AtomType *epsilon_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  reference pvVar7;
  size_type sVar8;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  int mAtt;
  int nRep;
  RealType epsilon;
  RealType sigma;
  MieInteractionType *mit;
  int atid2;
  int atid1;
  AtomType *at2;
  AtomType *at1;
  int mietid2;
  int mietid1;
  NonBondedInteractionType *nbt;
  KeyType keys;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  AtomType *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffdb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  errorStruct *in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde0;
  AtomType *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  value_type in_stack_fffffffffffffdf4;
  RealType in_stack_fffffffffffffe78;
  AtomType *in_stack_fffffffffffffe80;
  AtomType *in_stack_fffffffffffffe88;
  Mie *in_stack_fffffffffffffe90;
  string local_f8 [32];
  string local_d8 [32];
  MieInteractionType *local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  int local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_84;
  AtomType *local_80;
  AtomType *local_78;
  value_type local_48;
  value_type local_44;
  AtomType *local_40;
  undefined1 local_38 [32];
  NonBondedInteractionTypeContainer *local_18;
  undefined4 local_c;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x300108);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x300121);
  std::
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
           *)0x300132);
  ForceField::getNAtomType((ForceField *)0x300143);
  local_c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (value_type_conflict2 *)in_stack_fffffffffffffdd0);
  local_18 = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x70));
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
                       *)(local_38 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3001a1);
  local_40 = (AtomType *)
             TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                       ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
                        in_stack_fffffffffffffdd0,(MapTypeIterator *)in_stack_fffffffffffffdc8);
  while (local_40 != (AtomType *)0x0) {
    bVar2 = NonBondedInteractionType::isMie((NonBondedInteractionType *)local_40);
    if (bVar2) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffdb8,
                 (MapTypeIterator *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffdc0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdc0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,0);
      local_78 = ForceField::getAtomType
                           ((ForceField *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (string *)in_stack_fffffffffffffde8);
      if (local_78 == (AtomType *)0x0) {
        in_stack_fffffffffffffe78 = 0.0;
        in_stack_fffffffffffffe80 = (AtomType *)local_38;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe80,0);
        in_stack_fffffffffffffe88 = (AtomType *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe90 = (Mie *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe80,1);
        uVar3 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "Mie::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n",
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,uVar3);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      uVar3 = *(undefined8 *)(in_RDI + 0x70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,1);
      epsilon_00 = ForceField::getAtomType
                             ((ForceField *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (string *)in_stack_fffffffffffffde8);
      local_80 = epsilon_00;
      if (epsilon_00 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,1);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,0);
        uVar5 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,1);
        uVar6 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "Mie::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,uVar4,uVar5,uVar6);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      local_84 = AtomType::getIdent(local_78);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
      if (*pvVar7 == -1) {
        sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x300534);
        local_44 = (value_type)sVar8;
        pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffdd0,
                           (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        vVar1 = local_44;
        local_98 = (_Base_ptr)pVar9.first._M_node;
        local_90 = pVar9.second;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
        *pvVar7 = vVar1;
      }
      local_9c = AtomType::getIdent(local_80);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
      if (*pvVar7 == -1) {
        sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3005f2);
        local_48 = (value_type)sVar8;
        pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffdd0,
                           (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        local_b0 = (_Base_ptr)pVar9.first._M_node;
        local_a8 = pVar9.second;
        in_stack_fffffffffffffdf4 = local_48;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
        *pvVar7 = in_stack_fffffffffffffdf4;
      }
      in_stack_fffffffffffffde8 = local_40;
      if (local_40 == (AtomType *)0x0) {
        local_b8 = (MieInteractionType *)0x0;
      }
      else {
        local_b8 = (MieInteractionType *)
                   __dynamic_cast(local_40,&NonBondedInteractionType::typeinfo,
                                  &MieInteractionType::typeinfo,0);
      }
      if (local_b8 == (MieInteractionType *)0x0) {
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffda8);
        uVar4 = std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffda8);
        in_stack_fffffffffffffdc8 = local_f8;
        uVar5 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffdd0 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "Mie::initialize could not convert NonBondedInteractionType\n\tto MieInteractionType for %s - %s interaction.\n"
                 ,uVar4,uVar5);
        std::__cxx11::string::~string(in_stack_fffffffffffffdc8);
        std::__cxx11::string::~string(local_d8);
        *(undefined4 *)((long)in_stack_fffffffffffffdd0->errMsg + 0x7d4) = 1;
        *(undefined4 *)((long)in_stack_fffffffffffffdd0->errMsg + 2000) = 1;
        simError();
      }
      in_stack_fffffffffffffdc0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)MieInteractionType::getSigma(local_b8);
      in_stack_fffffffffffffdb8 =
           (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
           MieInteractionType::getEpsilon(local_b8);
      in_stack_fffffffffffffdb4 = MieInteractionType::getNrep(local_b8);
      in_stack_fffffffffffffdb0 = MieInteractionType::getMatt(local_b8);
      addExplicitInteraction
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78,(RealType)epsilon_00,(int)((ulong)uVar3 >> 0x20),
                 (int)uVar3);
    }
    in_stack_fffffffffffffda8 =
         (AtomType *)
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_stack_fffffffffffffdd0,
                    (MapTypeIterator *)in_stack_fffffffffffffdc8);
    local_40 = in_stack_fffffffffffffda8;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void Mie::initialize() {
    MieTypes.clear();
    MieTids.clear();
    MixingMap.clear();
    MieTids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int mietid1, mietid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isMie()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Mie::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Mie::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (MieTids[atid1] == -1) {
          mietid1 = MieTypes.size();
          MieTypes.insert(atid1);
          MieTids[atid1] = mietid1;
        }
        int atid2 = at2->getIdent();
        if (MieTids[atid2] == -1) {
          mietid2 = MieTypes.size();
          MieTypes.insert(atid2);
          MieTids[atid2] = mietid2;
        }

        MieInteractionType* mit = dynamic_cast<MieInteractionType*>(nbt);
        if (mit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Mie::initialize could not convert NonBondedInteractionType\n"
              "\tto MieInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType sigma   = mit->getSigma();
        RealType epsilon = mit->getEpsilon();
        int nRep         = mit->getNrep();
        int mAtt         = mit->getMatt();

        addExplicitInteraction(at1, at2, sigma, epsilon, nRep, mAtt);
      }
    }
    initialized_ = true;
  }